

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDefines.h
# Opt level: O0

void __thiscall
KDIS::KException::KException<unsigned_int>
          (KException *this,KString *Text,KUINT16 EC,uint AdditonalInfo)

{
  ostream *poVar1;
  KUINT16 ErrorCode;
  string local_1f8 [32];
  KString local_1d8;
  stringstream local_1a8 [8];
  KStringStream ss;
  ostream local_198 [376];
  uint local_20;
  KUINT16 local_1a;
  uint AdditonalInfo_local;
  KUINT16 EC_local;
  KString *Text_local;
  KException *this_local;
  
  local_20 = AdditonalInfo;
  local_1a = EC;
  _AdditonalInfo_local = Text;
  Text_local = (KString *)this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__KException_0032bc20;
  this->m_ui16ErrorCode = local_1a;
  std::__cxx11::string::string((string *)&this->m_sErrorText);
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,(string *)_AdditonalInfo_local);
  poVar1 = std::operator<<(poVar1,": ");
  KDIS::GetErrorText_abi_cxx11_(&local_1d8,(KDIS *)(ulong)local_1a,ErrorCode);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d8);
  poVar1 = std::operator<<(poVar1,(string *)&this->m_sErrorText);
  std::ostream::operator<<(poVar1,local_20);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_sErrorText,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

KException(const KString &Text, KUINT16 EC, T AdditonalInfo) :
        m_ui16ErrorCode( EC )
    {
        KStringStream ss;
        ss << Text << ": " << GetErrorText( EC ) << m_sErrorText << AdditonalInfo;
        m_sErrorText = ss.str();
    }